

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<Neural_Network> *this;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  _Ios_Openmode _Var1;
  RL_Pacman_Agent *pRVar2;
  ostream *poVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  reference o;
  time_t __val;
  char *pcVar7;
  double dVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1400;
  double local_1318;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1230;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1210;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11f2;
  undefined1 local_11f1;
  string local_11f0;
  byte local_11cb;
  allocator local_11ca;
  byte local_11c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11a8;
  StatisticInfo local_1188;
  string local_1170;
  string local_1150;
  string local_1130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1068;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1028;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_fe8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa8;
  iterator local_f68;
  size_type local_f60;
  undefined1 local_f58 [8];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  json;
  ofstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca0;
  undefined1 local_c80 [8];
  string statistics_path;
  stringstream local_c48 [8];
  stringstream ss;
  ostream local_c38 [376];
  string local_ac0 [8];
  string arguments_json;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  arguments;
  undefined1 local_a68 [8];
  string nn_path;
  string local_a28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  StatisticInfo local_988;
  StatisticInfo local_970;
  int local_954;
  undefined1 auStack_950 [4];
  int i_1;
  StatisticInfo avg;
  Statistics s_log_test;
  Game game_test;
  double dStack_5e8;
  uint j_1;
  double maxtestevaluation;
  double dStack_5d8;
  int maxtest;
  double maxtestwins;
  double maxtestcompletion;
  string nn_id;
  undefined1 local_5a0 [4];
  uint j;
  pointer local_598;
  StatisticInfo local_588;
  pointer local_570;
  double win_ratio_test;
  StatisticInfo info;
  double mse;
  int i;
  int i_start_evaluation;
  bool is_rl;
  vector<Neural_Network,_std::allocator<Neural_Network>_> last_nns;
  undefined1 local_518 [8];
  vector<Neural_Network,_std::allocator<Neural_Network>_> max_nns;
  double max_win_ratio;
  Statistics s_test;
  Statistics s_log;
  char str [200];
  string local_310;
  RL_Pacman_Agent *local_2f0;
  Agent *pacman_ai;
  undefined1 local_2d8 [8];
  Game game;
  char **argv_local;
  int argc_local;
  
  game._696_8_ = argv;
  std::ios_base::setf((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_fixed);
  std::ios_base::precision((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),1);
  Arguments::init((Arguments *)(ulong)(uint)argc,(EVP_PKEY_CTX *)game._696_8_);
  Arguments::postprocess();
  srand(Arguments::random_seed);
  Game::Game((Game *)local_2d8);
  Game::load_maze((Game *)local_2d8);
  switch(Arguments::pacman_ai_agent) {
  case PATHFINDING:
    pRVar2 = (RL_Pacman_Agent *)operator_new(8);
    memset(pRVar2,0,8);
    Pathfinding_Pacman_Agent::Pathfinding_Pacman_Agent((Pathfinding_Pacman_Agent *)pRVar2);
    local_2f0 = pRVar2;
    break;
  case INPUT:
    pRVar2 = (RL_Pacman_Agent *)operator_new(8);
    memset(pRVar2,0,8);
    Input_Pacman_Agent::Input_Pacman_Agent((Input_Pacman_Agent *)pRVar2);
    local_2f0 = pRVar2;
    break;
  case RANDOM:
    pRVar2 = (RL_Pacman_Agent *)operator_new(8);
    memset(pRVar2,0,8);
    Random_Pacman_Agent::Random_Pacman_Agent((Random_Pacman_Agent *)pRVar2);
    local_2f0 = pRVar2;
    break;
  case RL:
    pRVar2 = (RL_Pacman_Agent *)operator_new(0x118);
    RL_Pacman_Agent::RL_Pacman_Agent(pRVar2);
    local_2f0 = pRVar2;
    break;
  case NN:
    pRVar2 = (RL_Pacman_Agent *)operator_new(200);
    std::__cxx11::string::string
              ((string *)&local_310,(string *)&Arguments::neural_network_path_abi_cxx11_);
    NN_Pacman_Agent::NN_Pacman_Agent((NN_Pacman_Agent *)pRVar2,&local_310);
    local_2f0 = pRVar2;
    std::__cxx11::string::~string((string *)&local_310);
    break;
  default:
    sprintf((char *)&s_log.totals_always.mse,"Invalid pacman AI Agent enum value");
    poVar3 = std::operator<<((ostream *)&std::cout,"Error[");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/albertsgrc[P]q-mspacman/src/main.cc"
                            );
    poVar3 = std::operator<<(poVar3,"][");
    poVar3 = std::operator<<(poVar3,"main");
    poVar3 = std::operator<<(poVar3,"][Line ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x98);
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,(char *)&s_log.totals_always.mse);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  Game::set_ai((Game *)local_2d8,&local_2f0->super_Agent);
  Statistics::Statistics
            ((Statistics *)&s_test.totals_always.mse,Arguments::logging_statistics_precision);
  Statistics::Statistics((Statistics *)&max_win_ratio,Arguments::test_statistics_precision);
  max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xbff0000000000000;
  sVar4 = (size_type)Arguments::test_sampling;
  this = (allocator<Neural_Network> *)
         ((long)&last_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<Neural_Network>::allocator(this);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518,sVar4,this);
  std::allocator<Neural_Network>::~allocator
            ((allocator<Neural_Network> *)
             ((long)&last_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  sVar4 = (size_type)Arguments::test_sampling;
  std::allocator<Neural_Network>::allocator((allocator<Neural_Network> *)((long)&i + 3));
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::vector
            ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)&i_start_evaluation,sVar4,
             (allocator<Neural_Network> *)((long)&i + 3));
  std::allocator<Neural_Network>::~allocator((allocator<Neural_Network> *)((long)&i + 3));
  i._2_1_ = Arguments::pacman_ai_agent == RL;
  poVar3 = std::operator<<((ostream *)&std::cout,"Wins || Completion");
  pcVar7 = "";
  if ((i._2_1_ & 1) != 0) {
    pcVar7 = " || MSE";
  }
  poVar3 = std::operator<<(poVar3,pcVar7);
  poVar3 = std::operator<<(poVar3," (Last ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,s_test.totals_always.mse._0_4_);
  poVar3 = std::operator<<(poVar3," :: Always)");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  dVar8 = (double)Arguments::plays * Arguments::nn_evaluation_start;
  for (mse._4_4_ = 0; mse._4_4_ < Arguments::plays; mse._4_4_ = mse._4_4_ + 1) {
    if (((i._2_1_ & 1) != 0) && (mse._4_4_ % Arguments::test_sampling_interval == 0)) {
      pvVar5 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::operator[]
                         ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)
                          &i_start_evaluation,
                          (long)(int)((long)((ulong)(uint)((int)((long)mse._4_4_ %
                                                                (long)Arguments::
                                                                      test_statistics_precision) >>
                                                          0x1f) << 0x20 |
                                            (long)mse._4_4_ %
                                            (long)Arguments::test_statistics_precision & 0xffffffffU
                                            ) / (long)Arguments::test_sampling_interval));
      Neural_Network::from_weights(pvVar5,&local_2f0->nn);
    }
    Game::play((Game *)local_2d8);
    if ((i._2_1_ & 1) == 0) {
      local_1318 = 0.0;
    }
    else {
      local_1318 = local_2f0->mse_sum_last /
                   (double)(int)game.state.powerpills._M_h._M_single_bucket;
    }
    info.mse = local_1318;
    StatisticInfo::StatisticInfo
              ((StatisticInfo *)&win_ratio_test,(GameResult *)&game.pacman,local_1318);
    Statistics::new_observation
              ((Statistics *)&s_test.totals_always.mse,(StatisticInfo *)&win_ratio_test);
    Statistics::new_observation((Statistics *)&max_win_ratio,(StatisticInfo *)&win_ratio_test);
    if (((int)dVar8 <= mse._4_4_) && ((i._2_1_ & 1) != 0)) {
      if (Arguments::nn_evaluation_attribute == WINS) {
        Statistics::avg(&local_588,(Statistics *)&max_win_ratio);
        local_570 = (pointer)local_588.won;
      }
      else {
        Statistics::avg((StatisticInfo *)local_5a0,(Statistics *)&max_win_ratio);
        local_570 = local_598;
      }
      if ((double)max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage < (double)local_570) {
        max_nns.super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_570;
        for (nn_id.field_2._12_4_ = 0; uVar6 = (ulong)(uint)nn_id.field_2._12_4_,
            sVar4 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::size
                              ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518)
            , uVar6 < sVar4; nn_id.field_2._12_4_ = nn_id.field_2._12_4_ + 1) {
          pvVar5 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::operator[]
                             ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518,
                              (ulong)(uint)nn_id.field_2._12_4_);
          o = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::operator[]
                        ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)
                         &i_start_evaluation,(ulong)(uint)nn_id.field_2._12_4_);
          Neural_Network::from_weights(pvVar5,o);
        }
      }
    }
    if (mse._4_4_ % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
      std::operator<<((ostream *)&std::cout,"\r");
      print_info((Statistics *)&s_test.totals_always.mse,(bool)(i._2_1_ & 1));
      if (((i._2_1_ & 1) != 0) && ((int)dVar8 <= mse._4_4_)) {
        poVar3 = std::operator<<((ostream *)&std::cout," ** Max wins: ");
        std::ostream::operator<<
                  (poVar3,(double)max_nns.
                                  super__Vector_base<Neural_Network,_std::allocator<Neural_Network>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage * 100.0);
      }
      std::operator<<((ostream *)&std::cout,"  ");
      std::ostream::flush();
    }
    Game::reset((Game *)local_2d8);
  }
  std::__cxx11::string::string((string *)&maxtestcompletion);
  if (((i._2_1_ & 1) != 0) &&
     (pvVar5 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::operator[]
                         ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518,0),
     (pvVar5->reserved & 1U) != 0)) {
    maxtestevaluation._4_4_ = -1;
    dStack_5e8 = -1.0;
    for (game_test._700_4_ = 0; uVar6 = (ulong)(uint)game_test._700_4_,
        sVar4 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::size
                          ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518),
        uVar6 < sVar4; game_test._700_4_ = game_test._700_4_ + 1) {
      poVar3 = (ostream *)
               std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"Testing best agent: Wins || Completion (");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,Arguments::test_statistics_precision -
                                 game_test._700_4_ * Arguments::test_sampling_interval);
      poVar3 = std::operator<<(poVar3," before)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      Game::Game((Game *)&s_log_test.totals_always.mse);
      Game::load_maze((Game *)&s_log_test.totals_always.mse);
      pRVar2 = (RL_Pacman_Agent *)operator_new(200);
      pvVar5 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::operator[]
                         ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518,
                          (ulong)(uint)game_test._700_4_);
      NN_Pacman_Agent::NN_Pacman_Agent((NN_Pacman_Agent *)pRVar2,pvVar5);
      local_2f0 = pRVar2;
      Game::set_ai((Game *)&s_log_test.totals_always.mse,(Agent *)pRVar2);
      Statistics::Statistics((Statistics *)&avg.mse,Arguments::logging_statistics_precision);
      StatisticInfo::StatisticInfo((StatisticInfo *)auStack_950);
      for (local_954 = 0; local_954 < Arguments::n_games_test; local_954 = local_954 + 1) {
        Game::play((Game *)&s_log_test.totals_always.mse);
        StatisticInfo::StatisticInfo(&local_970,(GameResult *)&game_test.pacman);
        Statistics::new_observation((Statistics *)&avg.mse,&local_970);
        if (local_954 % Arguments::logging_update_rate == Arguments::logging_update_rate + -1) {
          Statistics::avg_always(&local_988,(Statistics *)&avg.mse);
          StatisticInfo::operator=((StatisticInfo *)auStack_950,&local_988);
          poVar3 = std::operator<<((ostream *)&std::cout,"\r[");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)s_log_test.totals.mse);
          poVar3 = std::operator<<(poVar3,"/");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,avg.mse._4_4_);
          poVar3 = std::operator<<(poVar3,"] ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,_auStack_950 * 100.0);
          poVar3 = std::operator<<(poVar3,"% || ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,avg.won * 100.0);
          std::operator<<(poVar3,"%");
          std::ostream::flush();
        }
        Game::reset((Game *)&s_log_test.totals_always.mse);
      }
      if ((Arguments::nn_evaluation_attribute != WINS) || (_auStack_950 <= dStack_5e8)) {
        if ((Arguments::nn_evaluation_attribute == COMPLETION) && (dStack_5e8 < avg.won)) {
          dStack_5e8 = avg.won;
          dStack_5d8 = _auStack_950;
          maxtestwins = avg.won;
          maxtestevaluation._4_4_ = game_test._700_4_;
        }
      }
      else {
        dStack_5e8 = _auStack_950;
        dStack_5d8 = _auStack_950;
        maxtestwins = avg.won;
        maxtestevaluation._4_4_ = game_test._700_4_;
      }
      Statistics::~Statistics((Statistics *)&avg.mse);
      Game::~Game((Game *)&s_log_test.totals_always.mse);
    }
    id_abi_cxx11_();
    std::operator+(&local_9e8,"nn",&local_a08);
    std::operator+(&local_9c8,&local_9e8,"-");
    std::__cxx11::to_string((string *)((long)&nn_path.field_2 + 8),(int)(dStack_5e8 * 1000.0));
    pad(&local_a28,(string *)((long)&nn_path.field_2 + 8),'0',3);
    std::operator+(&local_9a8,&local_9c8,&local_a28);
    std::__cxx11::string::operator=((string *)&maxtestcompletion,(string *)&local_9a8);
    std::__cxx11::string::~string((string *)&local_9a8);
    std::__cxx11::string::~string((string *)&local_a28);
    std::__cxx11::string::~string((string *)(nn_path.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_9c8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::__cxx11::string::~string((string *)&local_a08);
    system("mkdir -p ../data/neural-networks");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &arguments.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,"../data/neural-networks/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxtestcompletion);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &arguments.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,".txt");
    std::__cxx11::string::~string
              ((string *)
               &arguments.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pvVar5 = std::vector<Neural_Network,_std::allocator<Neural_Network>_>::operator[]
                       ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518,
                        (long)maxtestevaluation._4_4_);
    Neural_Network::write_file(pvVar5,(string *)local_a68);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Written best agent\'s neural network to ");
    std::operator<<(poVar3,(string *)local_a68);
    std::__cxx11::string::~string((string *)local_a68);
  }
  if ((Arguments::non_interactive & 1U) != 0) {
    Arguments::create_json_abi_cxx11_();
    std::__cxx11::string::string(local_ac0);
    _Var1 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_c48,local_ac0,_Var1);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&statistics_path.field_2 + 8),
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&arguments_json.field_2 + 8));
    write_json((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)((long)&statistics_path.field_2 + 8),local_c38);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&statistics_path.field_2 + 8));
    system("mkdir -p ../data/statistics");
    std::__cxx11::string::string((string *)local_c80);
    if ((i._2_1_ & 1) == 0) {
      id_abi_cxx11_();
      std::operator+(&local_d20,"../data/statistics/",&local_d40);
      std::operator+(&local_d00,&local_d20,"-test.json");
      std::__cxx11::string::operator=((string *)local_c80,(string *)&local_d00);
      std::__cxx11::string::~string((string *)&local_d00);
      std::__cxx11::string::~string((string *)&local_d20);
      std::__cxx11::string::~string((string *)&local_d40);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_ce0,(ulong)&maxtestcompletion);
      std::operator+(&local_cc0,"../data/statistics/",&local_ce0);
      std::operator+(&local_ca0,&local_cc0,".json");
      std::__cxx11::string::operator=((string *)local_c80,(string *)&local_ca0);
      std::__cxx11::string::~string((string *)&local_ca0);
      std::__cxx11::string::~string((string *)&local_cc0);
      std::__cxx11::string::~string((string *)&local_ce0);
    }
    std::ofstream::ofstream
              (&json.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ofstream::open((string *)
                        &json.
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(_Ios_Openmode)local_c80
                       );
    local_11f1 = 1;
    local_10f0 = &local_10e8;
    std::__cxx11::stringstream::str();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_10e8,(char (*) [10])"arguments",&local_1110);
    local_10f0 = &local_10a8;
    std::__cxx11::to_string(&local_1130,dStack_5d8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_10a8,(char (*) [5])"wins",&local_1130);
    local_10f0 = &local_1068;
    std::__cxx11::to_string(&local_1150,maxtestwins);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_1068,(char (*) [11])"completion",&local_1150);
    local_10f0 = &local_1028;
    Statistics::avg(&local_1188,(Statistics *)&s_test.totals_always.mse);
    std::__cxx11::to_string(&local_1170,local_1188.mse);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_1028,(char (*) [4])"mse",&local_1170);
    local_11c9 = 0;
    local_11cb = 0;
    local_10f0 = &pStack_fe8;
    if ((i._2_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      local_11cb = 1;
      std::__cxx11::string::string((string *)&local_11a8,"null",&local_11ca);
    }
    else {
      std::operator+(&local_11c8,'\"',
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &maxtestcompletion);
      local_11c9 = 1;
      std::operator+(&local_11a8,&local_11c8,'\"');
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&pStack_fe8,(char (*) [15])"neural_network",&local_11a8);
    local_10f0 = &local_fa8;
    __val = time((time_t *)0x0);
    std::__cxx11::to_string(&local_11f0,__val);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_fa8,(char (*) [10])"timestamp",&local_11f0);
    local_11f1 = 0;
    local_f68 = &local_10e8;
    local_f60 = 6;
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_11f2);
    __l._M_len = local_f60;
    __l._M_array = local_f68;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f58,__l,&local_11f2);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_11f2);
    local_1400 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_f68;
    do {
      local_1400 = local_1400 + -1;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_1400);
    } while (local_1400 != &local_10e8);
    std::__cxx11::string::~string((string *)&local_11f0);
    std::__cxx11::string::~string((string *)&local_11a8);
    if ((local_11cb & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_11ca);
    }
    if ((local_11c9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_11c8);
    }
    std::__cxx11::string::~string((string *)&local_1170);
    std::__cxx11::string::~string((string *)&local_1150);
    std::__cxx11::string::~string((string *)&local_1130);
    std::__cxx11::string::~string((string *)&local_1110);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1210,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f58);
    write_json(&local_1210,
               (ostream *)
               &json.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1210);
    std::ofstream::close();
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::operator+(&local_1230,"Written statistics information to ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c80);
    std::operator<<(poVar3,(string *)&local_1230);
    std::__cxx11::string::~string((string *)&local_1230);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1248,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_f58);
    write_json(&local_1248,(ostream *)&std::cerr);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1248);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_f58);
    std::ofstream::~ofstream
              (&json.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_c80);
    std::__cxx11::stringstream::~stringstream(local_c48);
    std::__cxx11::string::~string(local_ac0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&arguments_json.field_2 + 8));
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&maxtestcompletion);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector
            ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)&i_start_evaluation);
  std::vector<Neural_Network,_std::allocator<Neural_Network>_>::~vector
            ((vector<Neural_Network,_std::allocator<Neural_Network>_> *)local_518);
  Statistics::~Statistics((Statistics *)&max_win_ratio);
  Statistics::~Statistics((Statistics *)&s_test.totals_always.mse);
  Game::~Game((Game *)local_2d8);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout.setf(ios::fixed);
    cout.precision(1);

    Arguments::init(argc, argv);
    Arguments::postprocess();

    srand(Arguments::random_seed);

    Game game;

    game.load_maze();

    Agent* pacman_ai;

    switch (Arguments::pacman_ai_agent) {
        case PATHFINDING: pacman_ai = new Pathfinding_Pacman_Agent(); break;
        case INPUT: pacman_ai = new Input_Pacman_Agent(); break;
        case RANDOM: pacman_ai = new Random_Pacman_Agent(); break;
        case RL: pacman_ai = new RL_Pacman_Agent(); break;
        case NN: pacman_ai = new NN_Pacman_Agent(Arguments::neural_network_path); break;
        default: ensure(false, "Invalid pacman AI Agent enum value");
    }

    game.set_ai(pacman_ai);

    Statistics s_log(Arguments::logging_statistics_precision);
    Statistics s_test(Arguments::test_statistics_precision);

    double max_win_ratio = -1;
    vector<Neural_Network> max_nns(Arguments::test_sampling);
    vector<Neural_Network> last_nns(Arguments::test_sampling);


    bool is_rl = Arguments::pacman_ai_agent == RL;
    cout << "Wins || Completion" << (is_rl ? " || MSE" : "") <<  " (Last " << s_log.precision << " :: Always)" << endl;

    /** TRAINING STAGE **/
    int i_start_evaluation = Arguments::plays*Arguments::nn_evaluation_start;
    for (int i = 0; i < Arguments::plays; ++i) {
        if (is_rl and i%Arguments::test_sampling_interval == 0)
            last_nns[(i%Arguments::test_statistics_precision)/Arguments::test_sampling_interval].from_weights(((RL_Pacman_Agent *) (pacman_ai))->nn);

        game.play();

        double mse = is_rl ? ((RL_Pacman_Agent*)(pacman_ai))->mse_sum_last/game.state.round : 0;
        StatisticInfo info(game.result, mse);
        s_log.new_observation(info);
        s_test.new_observation(info);

        double win_ratio_test;
        if (i >= i_start_evaluation and is_rl) {
            if (Arguments::nn_evaluation_attribute == WINS) win_ratio_test = s_test.avg().won;
            else win_ratio_test = s_test.avg().completion;

            if (win_ratio_test > max_win_ratio) {
                max_win_ratio = win_ratio_test;
                for (uint j = 0; j < max_nns.size(); ++j) max_nns[j].from_weights(last_nns[j]);
            }
        }

        if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
            cout << "\r";
            print_info(s_log, is_rl);
            if (is_rl and i >= i_start_evaluation) cout << " ** Max wins: " << 100*max_win_ratio;
            cout << "  ";
            cout.flush();
        }

        game.reset();
    }

    string nn_id;

    double maxtestcompletion;
    double maxtestwins;
    /** TESTING STAGE **/
    if (is_rl and max_nns[0].reserved) {
        int maxtest = -1;
        double maxtestevaluation = -1;

        for (uint j = 0; j < max_nns.size(); ++j) {
            cout << endl << "Testing best agent: Wins || Completion ("
                 << Arguments::test_statistics_precision - j*Arguments::test_sampling_interval << " before)" << endl;

            Game game_test;
            game_test.load_maze();
            pacman_ai = new NN_Pacman_Agent(max_nns[j]);
            game_test.set_ai(pacman_ai);

            Statistics s_log_test(Arguments::logging_statistics_precision);
            StatisticInfo avg;

            for (int i = 0; i < Arguments::n_games_test; ++i) {
                game_test.play();

                s_log_test.new_observation(StatisticInfo(game_test.result));

                if (i%Arguments::logging_update_rate == Arguments::logging_update_rate - 1) {
                    avg = s_log_test.avg_always();
                    cout << "\r[" << int(s_log_test.totals_always.won) << "/" << s_log_test.observation_count << "] "
                         << 100*avg.won << "% || " << 100*avg.completion << "%";

                    cout.flush();
                }

                game_test.reset();
            }

            if (Arguments::nn_evaluation_attribute == WINS and avg.won > maxtestevaluation) {
                maxtestevaluation = avg.won;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;

            }
            else if (Arguments::nn_evaluation_attribute == COMPLETION and avg.completion > maxtestevaluation) {
                maxtestevaluation = avg.completion;
                maxtestwins = avg.won;
                maxtestcompletion = avg.completion;
                maxtest = j;
            }
        }

        nn_id = "nn" + id() + "-" + pad(to_string(int(1000*maxtestevaluation)), '0', 3);

        system("mkdir -p ../data/neural-networks");
        string nn_path = "../data/neural-networks/" + nn_id + ".txt";
        max_nns[maxtest].write_file(nn_path);
        cout << endl << "Written best agent's neural network to " << nn_path;
    }

    if (Arguments::non_interactive) {
        vector<pair<string, string>> arguments = Arguments::create_json();

        string arguments_json;
        stringstream ss(arguments_json);
        write_json(arguments, ss);

        system("mkdir -p ../data/statistics");

        string statistics_path;
        if (is_rl)
            statistics_path = "../data/statistics/" + nn_id.substr(2) + ".json";
        else
            statistics_path = "../data/statistics/" + id() + "-test.json";

        ofstream file;
        file.open(statistics_path);

        vector<pair<string, string>> json = {
                { "arguments", ss.str() },
                { "wins", to_string(maxtestwins) },
                { "completion", to_string(maxtestcompletion) },
                { "mse", to_string(s_log.avg().mse) },
                { "neural_network", (is_rl ? ('"' + nn_id + '"') : "null") },
                { "timestamp", to_string(time(0)) }
        };

        write_json(json, file);

        file.close();

        cout << endl << "Written statistics information to " + statistics_path;

        write_json(json, cerr);
    }

    cout << endl;
}